

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O1

void re2::RegexpCaptureNames(void)

{
  _Rb_tree_header *__last1;
  bool bVar1;
  int iVar2;
  Regexp *this;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *pmVar3;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  want;
  RegexpStatus status;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_1e8;
  RegexpStatus local_1b8;
  LogMessage local_198;
  
  local_1b8.code_ = kRegexpSuccess;
  local_1b8.error_arg_.ptr_ = (char *)0x0;
  local_1b8.error_arg_.length_ = 0;
  local_1b8.tmp_ = (string *)0x0;
  local_198._0_8_ = "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)";
  local_198._8_4_ = 0x23;
  this = Regexp::Parse((StringPiece *)&local_198,PerlX,&local_1b8);
  if (local_1b8.code_ != kRegexpSuccess) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x43,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: status.ok()",0x19);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = Regexp::NumCaptures(this);
  if (iVar2 != 4) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x44,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: (4) == (x->NumCaptures())",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  this_00 = &Regexp::CaptureNames_abi_cxx11_(this)->_M_t;
  if (this_00 ==
      (_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x46,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: have != NULL",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if ((this_00->_M_impl).super__Rb_tree_header._M_node_count != 3) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x47,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_198 + 8),"Check failed: (3) == (have->size())",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  __last1 = &_Stack_1e8._M_impl.super__Rb_tree_header;
  _Stack_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.severity_ = 1;
  _Stack_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &__last1->_M_header;
  _Stack_1e8._M_impl.super__Rb_tree_header._M_header._M_right = &__last1->_M_header;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&_Stack_1e8,&local_198.severity_);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1181f1);
  local_198.severity_ = 3;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&_Stack_1e8,&local_198.severity_);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1181f4);
  local_198.severity_ = 4;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&_Stack_1e8,&local_198.severity_);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0x1181f1);
  if (_Stack_1e8._M_impl.super__Rb_tree_header._M_node_count ==
      (this_00->_M_impl).super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>>
                      ((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )_Stack_1e8._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )__last1,(this_00->_M_impl).super__Rb_tree_header._M_header._M_left);
    if (bVar1) goto LAB_0010cff7;
  }
  LogMessage::LogMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
             ,0x4d,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((long)&local_198 + 8),"Check failed: (want) == (*have)",0x1f);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
LAB_0010cff7:
  Regexp::Decref(this);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_00);
  operator_delete(this_00);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_1e8);
  RegexpStatus::~RegexpStatus(&local_1b8);
  return;
}

Assistant:

TEST(Regexp, CaptureNames) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<int, string>* have = x->CaptureNames();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(3, have->size());
  map<int, string> want;
  want[1] = "g1";
  want[3] = "g2";
  want[4] = "g1";

  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}